

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

symbolEncodingType_e
ZSTD_selectEncodingType
          (FSE_repeat *repeatMode,uint *count,uint max,size_t mostFrequent,size_t nbSeq,uint FSELog,
          FSE_CTable *prevCTable,short *defaultNorm,U32 defaultNormLog,
          ZSTD_defaultPolicy_e isDefaultAllowed,ZSTD_strategy strategy)

{
  uint uVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  size_t sVar5;
  size_t sVar6;
  uint *puVar7;
  ulong in_RCX;
  int *in_RDI;
  ulong in_R8;
  uint in_stack_00000018;
  size_t compressedCost;
  size_t NCountCost;
  size_t repeatCost;
  size_t basicCost;
  size_t dynamicFse_nbSeq_min;
  size_t baseLog;
  size_t mult;
  size_t staticFse_nbSeq_max;
  uint in_stack_00000214;
  size_t in_stack_00000218;
  uint in_stack_00000224;
  uint *in_stack_00000228;
  undefined8 in_stack_ffffffffffffff78;
  uint *puVar8;
  uint *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  short *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  FSE_CTable *in_stack_ffffffffffffffb8;
  
  uVar1 = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (in_RCX == in_R8) {
    *in_RDI = 0;
    if (((int)compressedCost != 0) && (in_R8 < 3)) {
      return set_basic;
    }
    return set_rle;
  }
  if ((uint)NCountCost < 4) {
    if ((int)compressedCost != 0) {
      uVar2 = (ulong)(10 - (uint)NCountCost);
      if ((in_stack_00000018 < 5) || (6 < in_stack_00000018)) {
        __assert_fail("defaultNormLog >= 5 && defaultNormLog <= 6",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4bd4,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
      if ((9 < uVar2) || (uVar2 < 7)) {
        __assert_fail("mult <= 9 && mult >= 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4bd5,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
      if ((*in_RDI == 2) && (in_R8 < 1000)) {
        return set_repeat;
      }
      if ((in_R8 < (1L << ((byte)in_stack_00000018 & 0x3f)) * uVar2 >> 3) ||
         (in_RCX < in_R8 >> ((byte)in_stack_00000018 - 1 & 0x3f))) {
        *in_RDI = 0;
        return set_basic;
      }
    }
  }
  else {
    if ((int)compressedCost == 0) {
      puVar3 = (uint *)0xffffffffffffffff;
    }
    else {
      puVar3 = (uint *)ZSTD_crossEntropyCost
                                 (in_stack_ffffffffffffff90,
                                  (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                  in_stack_ffffffffffffff80,
                                  (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
    puVar7 = puVar3;
    if (*in_RDI == 0) {
      puVar4 = (uint *)0xffffffffffffffff;
    }
    else {
      puVar4 = (uint *)ZSTD_fseBitCost(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,uVar1);
    }
    puVar8 = puVar4;
    sVar5 = ZSTD_NCountCost(in_stack_00000228,in_stack_00000224,in_stack_00000218,in_stack_00000214)
    ;
    sVar5 = sVar5 << 3;
    sVar6 = ZSTD_entropyCost(puVar7,(uint)((ulong)puVar8 >> 0x20),sVar5);
    puVar7 = (uint *)(sVar5 + sVar6);
    if ((int)compressedCost != 0) {
      uVar1 = ZSTD_isError(0x175861);
      if (uVar1 != 0) {
        __assert_fail("!ZSTD_isError(basicCost)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4bef,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
      if ((*in_RDI == 2) && (uVar1 = ZSTD_isError(0x17589e), uVar1 != 0)) {
        __assert_fail("!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4bf0,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
    }
    uVar1 = ZSTD_isError(0x1758d0);
    if (uVar1 != 0) {
      __assert_fail("!ZSTD_isError(NCountCost)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4bf2,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if ((uint *)0xffffffffffffff87 < puVar7) {
      __assert_fail("compressedCost < ERROR(maxCode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4bf3,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if ((puVar3 <= puVar4) && (puVar3 <= puVar7)) {
      if ((int)compressedCost != 0) {
        *in_RDI = 0;
        return set_basic;
      }
      __assert_fail("isDefaultAllowed",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4bf8,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if (puVar4 <= puVar7) {
      uVar1 = ZSTD_isError(0x175996);
      if (uVar1 == 0) {
        return set_repeat;
      }
      __assert_fail("!ZSTD_isError(repeatCost)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4bfe,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if ((puVar3 <= puVar7) || (puVar4 <= puVar7)) {
      __assert_fail("compressedCost < basicCost && compressedCost < repeatCost",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4c01,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
  }
  *in_RDI = 1;
  return set_compressed;
}

Assistant:

symbolEncodingType_e
ZSTD_selectEncodingType(
        FSE_repeat* repeatMode, unsigned const* count, unsigned const max,
        size_t const mostFrequent, size_t nbSeq, unsigned const FSELog,
        FSE_CTable const* prevCTable,
        short const* defaultNorm, U32 defaultNormLog,
        ZSTD_defaultPolicy_e const isDefaultAllowed,
        ZSTD_strategy const strategy)
{
    ZSTD_STATIC_ASSERT(ZSTD_defaultDisallowed == 0 && ZSTD_defaultAllowed != 0);
    if (mostFrequent == nbSeq) {
        *repeatMode = FSE_repeat_none;
        if (isDefaultAllowed && nbSeq <= 2) {
            /* Prefer set_basic over set_rle when there are 2 or fewer symbols,
             * since RLE uses 1 byte, but set_basic uses 5-6 bits per symbol.
             * If basic encoding isn't possible, always choose RLE.
             */
            DEBUGLOG(5, "Selected set_basic");
            return set_basic;
        }
        DEBUGLOG(5, "Selected set_rle");
        return set_rle;
    }
    if (strategy < ZSTD_lazy) {
        if (isDefaultAllowed) {
            size_t const staticFse_nbSeq_max = 1000;
            size_t const mult = 10 - strategy;
            size_t const baseLog = 3;
            size_t const dynamicFse_nbSeq_min = (((size_t)1 << defaultNormLog) * mult) >> baseLog;  /* 28-36 for offset, 56-72 for lengths */
            assert(defaultNormLog >= 5 && defaultNormLog <= 6);  /* xx_DEFAULTNORMLOG */
            assert(mult <= 9 && mult >= 7);
            if ( (*repeatMode == FSE_repeat_valid)
              && (nbSeq < staticFse_nbSeq_max) ) {
                DEBUGLOG(5, "Selected set_repeat");
                return set_repeat;
            }
            if ( (nbSeq < dynamicFse_nbSeq_min)
              || (mostFrequent < (nbSeq >> (defaultNormLog-1))) ) {
                DEBUGLOG(5, "Selected set_basic");
                /* The format allows default tables to be repeated, but it isn't useful.
                 * When using simple heuristics to select encoding type, we don't want
                 * to confuse these tables with dictionaries. When running more careful
                 * analysis, we don't need to waste time checking both repeating tables
                 * and default tables.
                 */
                *repeatMode = FSE_repeat_none;
                return set_basic;
            }
        }
    } else {
        size_t const basicCost = isDefaultAllowed ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, count, max) : ERROR(GENERIC);
        size_t const repeatCost = *repeatMode != FSE_repeat_none ? ZSTD_fseBitCost(prevCTable, count, max) : ERROR(GENERIC);
        size_t const NCountCost = ZSTD_NCountCost(count, max, nbSeq, FSELog);
        size_t const compressedCost = (NCountCost << 3) + ZSTD_entropyCost(count, max, nbSeq);

        if (isDefaultAllowed) {
            assert(!ZSTD_isError(basicCost));
            assert(!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost)));
        }
        assert(!ZSTD_isError(NCountCost));
        assert(compressedCost < ERROR(maxCode));
        DEBUGLOG(5, "Estimated bit costs: basic=%u\trepeat=%u\tcompressed=%u",
                    (unsigned)basicCost, (unsigned)repeatCost, (unsigned)compressedCost);
        if (basicCost <= repeatCost && basicCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_basic");
            assert(isDefaultAllowed);
            *repeatMode = FSE_repeat_none;
            return set_basic;
        }
        if (repeatCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_repeat");
            assert(!ZSTD_isError(repeatCost));
            return set_repeat;
        }
        assert(compressedCost < basicCost && compressedCost < repeatCost);
    }
    DEBUGLOG(5, "Selected set_compressed");
    *repeatMode = FSE_repeat_check;
    return set_compressed;
}